

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

bool __thiscall Application::queryConfirm(Application *this,string *query)

{
  int iVar1;
  ostream *poVar2;
  string value;
  char *local_30;
  undefined8 local_28;
  char local_20 [16];
  
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = '\0';
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,(string *)query);
  std::operator<<(poVar2,"?: ");
  std::operator>>((istream *)&std::cin,(string *)&local_30);
  iVar1 = toupper((int)*local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1 == 0x59;
}

Assistant:

bool Application::queryConfirm(const std::string &query) {
  std::string value;
  std::cout << std::endl << query << "?: ";
  std::cin >> value;
  return toupper(*value.c_str()) == 'Y';
}